

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::ChainImpl::haveBlockOnDisk(ChainImpl *this,int height)

{
  ChainstateManager *this_00;
  Chainstate *pCVar1;
  CBlockIndex *pCVar2;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x229,false);
  this_00 = chainman(this);
  pCVar1 = ChainstateManager::ActiveChainstate(this_00);
  pCVar2 = CChain::operator[](&pCVar1->m_chain,height);
  if ((pCVar2 == (CBlockIndex *)0x0) || ((pCVar2->nStatus & 8) == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = pCVar2->nTx != 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool haveBlockOnDisk(int height) override
    {
        LOCK(::cs_main);
        const CBlockIndex* block{chainman().ActiveChain()[height]};
        return block && ((block->nStatus & BLOCK_HAVE_DATA) != 0) && block->nTx > 0;
    }